

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode
deleteOneWayReference
          (UA_Server *server,UA_Session *session,UA_Node *node,UA_DeleteReferencesItem *item)

{
  UA_Logger *pp_Var1;
  size_t sVar2;
  void *__ptr;
  UA_Boolean UVar3;
  long lVar4;
  UA_Logger p_Var5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long lVar8;
  byte bVar9;
  
  bVar9 = 0;
  p_Var5 = (server->config).logger;
  if (p_Var5 != (UA_Logger)0x0) {
    sVar2 = (server->config).buildInfo.productUri.length;
    lVar8 = (long)p_Var5 * 0x50;
    do {
      UVar3 = UA_NodeId_equal((UA_NodeId *)&(session->clientDescription).applicationName.text.data,
                              (UA_NodeId *)(lVar8 + (sVar2 - 0x30)));
      if (((UVar3) &&
          (UVar3 = UA_NodeId_equal((UA_NodeId *)&(session->clientDescription).productUri.data,
                                   (UA_NodeId *)((sVar2 - 0x50) + lVar8)), UVar3)) &&
         ((char)(session->clientDescription).applicationName.text.length !=
          *(char *)((sVar2 - 0x38) + lVar8))) {
        lVar4 = sVar2 + lVar8;
        deleteMembers_noInit((undefined8 *)(lVar4 + -0x50),UA_TYPES + 0x38);
        *(undefined8 *)(lVar4 + -0x10) = 0;
        *(undefined8 *)(lVar4 + -8) = 0;
        *(undefined8 *)(lVar4 + -0x20) = 0;
        *(undefined8 *)(lVar4 + -0x18) = 0;
        *(undefined8 *)(lVar4 + -0x30) = 0;
        *(undefined8 *)(lVar4 + -0x28) = 0;
        *(undefined8 *)(lVar4 + -0x40) = 0;
        *(undefined8 *)(lVar4 + -0x38) = 0;
        *(undefined8 *)(lVar4 + -0x50) = 0;
        *(undefined8 *)(lVar4 + -0x48) = 0;
        sVar2 = (server->config).buildInfo.productUri.length;
        puVar6 = (undefined8 *)(sVar2 + (long)(server->config).logger * 0x50 + -0x50);
        puVar7 = (undefined8 *)(sVar2 + lVar8 + -0x50);
        for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
          *puVar7 = *puVar6;
          puVar6 = puVar6 + (ulong)bVar9 * -2 + 1;
          puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
        }
        pp_Var1 = &(server->config).logger;
        *pp_Var1 = *pp_Var1 + -1;
        if (*pp_Var1 == (UA_Logger)0x0) {
          __ptr = (void *)(server->config).buildInfo.productUri.length;
          if (__ptr != (void *)0x0) {
            free(__ptr);
            (server->config).buildInfo.productUri.length = 0;
            return 0;
          }
          return 0;
        }
        return 0;
      }
      p_Var5 = p_Var5 + -1;
      lVar8 = lVar8 + -0x50;
    } while (p_Var5 != (UA_Logger)0x0);
  }
  return 0x40bc0000;
}

Assistant:

static UA_StatusCode
deleteOneWayReference(UA_Server *server, UA_Session *session, UA_Node *node,
                      const UA_DeleteReferencesItem *item) {
    UA_Boolean edited = false;
    for(size_t i = node->referencesSize; i > 0; --i) {
        UA_ReferenceNode *ref = &node->references[i-1];
        if(!UA_NodeId_equal(&item->targetNodeId.nodeId, &ref->targetId.nodeId))
            continue;
        if(!UA_NodeId_equal(&item->referenceTypeId, &ref->referenceTypeId))
            continue;
        if(item->isForward == ref->isInverse)
            continue;
        UA_ReferenceNode_deleteMembers(ref);
        /* move the last entry to override the current position */
        node->references[i-1] = node->references[node->referencesSize-1];
        --node->referencesSize;
        edited = true;
        break;
    }
    if(!edited)
        return UA_STATUSCODE_UNCERTAINREFERENCENOTDELETED;
    /* we removed the last reference */
    if(node->referencesSize == 0 && node->references) {
        UA_free(node->references);
        node->references = NULL;
    }
    return UA_STATUSCODE_GOOD;;
}